

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

void __thiscall
aeron::archive::AeronArchive::stopRecording(AeronArchive *this,string *channel,int32_t streamId)

{
  int32_t local_44;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_40._8_8_ = 0;
  local_44 = streamId;
  local_40._M_unused._M_object = operator_new(0x18);
  *(AeronArchive **)local_40._M_unused._0_8_ = this;
  *(string **)((long)local_40._M_unused._0_8_ + 8) = channel;
  *(int32_t **)((long)local_40._M_unused._0_8_ + 0x10) = &local_44;
  local_28 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:174:9)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:174:9)>
             ::_M_manager;
  callAndPollForResponse(this,(function<bool_(long)> *)&local_40,"stop recording");
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void AeronArchive::stopRecording(const std::string& channel, std::int32_t streamId) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->stopRecording(channel, streamId, correlationId, controlSessionId_);
        },
        "stop recording");
}